

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgUtils.hpp
# Opt level: O2

unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_> __thiscall
TasGrid::Utils::make_unique<TasGrid::GridSequence,TasGrid::AccelerationContext_const*&>
          (Utils *this,AccelerationContext **args)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x120);
  puVar1[1] = *args;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined4 *)(puVar1 + 4) = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  *(undefined4 *)(puVar1 + 9) = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  *puVar1 = &PTR__GridSequence_001ff7c0;
  *(undefined4 *)(puVar1 + 0x12) = 0;
  memset(puVar1 + 0x13,0,0x88);
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args){
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}